

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall
capnp::EzRpcClient::Impl::Impl
          (Impl *this,sockaddr *serverAddress,uint addrSize,ReaderOptions readerOpts)

{
  int iVar1;
  undefined4 extraout_var;
  Own<kj::NetworkAddress> local_70;
  undefined1 local_60 [16];
  Own<kj::_::PromiseNode> local_50;
  Impl *local_40;
  uint64_t local_38;
  int local_30;
  
  EzRpcContext::getThreadLocal();
  iVar1 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))
            (&local_70,(long *)CONCAT44(extraout_var,iVar1),serverAddress,addrSize);
  connectAttach((capnp *)local_60,&local_70);
  local_30 = readerOpts.nestingLimit;
  local_40 = this;
  local_38 = readerOpts.traversalLimitInWords;
  kj::Promise<kj::Own<kj::AsyncIoStream>>::
  then<capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)(local_60 + 0x10),
             (anon_class_24_2_846dc7fe_for_func *)local_60,(PropagateException *)&local_40);
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_60 + 0x10));
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_60);
  kj::Own<kj::NetworkAddress>::dispose(&local_70);
  (this->clientContext).ptr.disposer = (Disposer *)0x0;
  (this->clientContext).ptr.ptr = (ClientContext *)0x0;
  return;
}

Assistant:

Impl(const struct sockaddr* serverAddress, uint addrSize,
       ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(
            connectAttach(context->getIoProvider().getNetwork()
                .getSockaddr(serverAddress, addrSize))
            .then([this, readerOpts](kj::Own<kj::AsyncIoStream>&& stream) {
              clientContext = kj::heap<ClientContext>(kj::mv(stream),
                                                      readerOpts);
            }).fork()) {}